

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c74_mock_clock.h
# Opt level: O0

void __thiscall c74::mock::clock::unset(clock *this)

{
  lock_guard<std::mutex> local_20;
  lock l_1;
  lock l;
  clock *this_local;
  
  std::lock_guard<std::mutex>::lock_guard(&l_1,&this->scheduled_events_mutex);
  std::
  multiset<c74::mock::clock::event,_std::less<c74::mock::clock::event>,_std::allocator<c74::mock::clock::event>_>
  ::clear(&this->scheduled_events);
  std::lock_guard<std::mutex>::~lock_guard(&l_1);
  std::lock_guard<std::mutex>::lock_guard(&local_20,&this->pending_events_mutex);
  std::vector<c74::mock::clock::event,_std::allocator<c74::mock::clock::event>_>::clear
            (&this->pending_events);
  std::lock_guard<std::mutex>::~lock_guard(&local_20);
  return;
}

Assistant:

void unset() {
            {
                lock l(scheduled_events_mutex);
                scheduled_events.clear();
            }
            {
                lock l(pending_events_mutex);
                pending_events.clear();
            }
        }